

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O0

object boost::python::detail::
       make_function_aux<void(*)(_object*,HighFreqDataType,int,HFParsingInfo,int),boost::python::default_call_policies,boost::mpl::vector6<void,_object*,HighFreqDataType,int,HFParsingInfo,int>,mpl_::int_<0>>
                 (object_base param_1,undefined8 param_2,undefined8 param_3,undefined8 param_4,
                 pair *param_5)

{
  caller<void_(*)(_object_*,_HighFreqDataType,_int,_HFParsingInfo,_int),_boost::python::default_call_policies,_boost::mpl::vector6<void,__object_*,_HighFreqDataType,_int,_HFParsingInfo,_int>_>
  *in_stack_ffffffffffffffa8;
  py_function *in_stack_ffffffffffffffb0;
  caller<void_(*)(_object_*,_HighFreqDataType,_int,_HFParsingInfo,_int),_boost::python::default_call_policies,_boost::mpl::vector6<void,__object_*,_HighFreqDataType,_int,_HFParsingInfo,_int>_>
  local_40;
  py_function local_38;
  pair *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  PyObject *local_8;
  
  local_30 = param_5;
  local_28 = param_4;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1.m_ptr;
  caller<void_(*)(_object_*,_HighFreqDataType,_int,_HFParsingInfo,_int),_boost::python::default_call_policies,_boost::mpl::vector6<void,__object_*,_HighFreqDataType,_int,_HFParsingInfo,_int>_>
  ::caller(&local_40,param_2);
  objects::py_function::
  py_function<boost::python::detail::caller<void(*)(_object*,HighFreqDataType,int,HFParsingInfo,int),boost::python::default_call_policies,boost::mpl::vector6<void,_object*,HighFreqDataType,int,HFParsingInfo,int>>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  objects::function_object((objects *)param_1.m_ptr,&local_38,local_30);
  objects::py_function::~py_function((py_function *)0x3cc7e1);
  return (object)(object_base)param_1.m_ptr;
}

Assistant:

object make_function_aux(
      F f
      , CallPolicies const& p
      , Sig const&
      , detail::keyword_range const& kw // a [begin,end) pair of iterators over keyword names
      , NumKeywords                     // An MPL integral type wrapper: the size of kw
      )
  {
      enum { arity = mpl::size<Sig>::value - 1 };
      
      typedef typename detail::error::more_keywords_than_function_arguments<
          NumKeywords::value, arity
          >::too_many_keywords assertion BOOST_ATTRIBUTE_UNUSED;
    
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
        , kw);
  }